

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O2

FEvent * __thiscall FEventTree::Successor(FEventTree *this,FEvent *event)

{
  FEventTree *pFVar1;
  FEventTree *pFVar2;
  bool bVar3;
  
  pFVar1 = (FEventTree *)event->Right;
  if ((FEventTree *)event->Right == this) {
    do {
      pFVar2 = (FEventTree *)(((FEventTree *)event)->Nil).Parent;
      if (pFVar2 == this) {
        return &pFVar2->Nil;
      }
      bVar3 = (FEventTree *)event == (FEventTree *)(pFVar2->Nil).Right;
      event = (FEvent *)pFVar2;
    } while (bVar3);
  }
  else {
    do {
      pFVar2 = pFVar1;
      pFVar1 = (FEventTree *)(pFVar2->Nil).Left;
    } while (pFVar1 != this);
  }
  return &pFVar2->Nil;
}

Assistant:

FEvent *FEventTree::Successor (FEvent *event) const
{
	if (event->Right != &Nil)
	{
		event = event->Right;
		while (event->Left != &Nil)
		{
			event = event->Left;
		}
		return event;
	}
	else
	{
		FEvent *y = event->Parent;
		while (y != &Nil && event == y->Right)
		{
			event = y;
			y = y->Parent;
		}
		return y;
	}
}